

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::DirectStateAccess::VertexArrays::EnableDisableAttributesTest::BuildProgram
          (EnableDisableAttributesTest *this,char *vertex_shader,bool bind_even_or_odd)

{
  size_type *psVar1;
  GLint GVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  string *psVar8;
  char *pcVar9;
  MessageBuilder *this_00;
  undefined4 *puVar10;
  GLuint i;
  char **value;
  long lVar11;
  uint uVar12;
  GLint log_size;
  Shader shader [2];
  GLint status_1;
  GLint status;
  uint uStack_1cc;
  int local_1c8;
  string attribute;
  long lVar7;
  
  uVar12 = (uint)bind_even_or_odd;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  shader[0].type = 0x8b31;
  shader[0].id = 0;
  shader[1].source = "#version 450\n\nout vec4 color;\n\nvoid main()\n{\n    color = vec4(1.0);}\n";
  shader[1].type = 0x8b30;
  shader[1].id = 0;
  shader[0].source = vertex_shader;
  GVar4 = (**(code **)(lVar7 + 0x3c8))();
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x147);
  for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 0x10) {
    if (*(long *)((long)&shader[0].source + lVar11) != 0) {
      uVar6 = (**(code **)(lVar7 + 0x3f0))(*(undefined4 *)((long)&shader[0].type + lVar11));
      *(undefined4 *)((long)&shader[0].id + lVar11) = uVar6;
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glCreateShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x151);
      (**(code **)(lVar7 + 0x10))(GVar4,*(undefined4 *)((long)&shader[0].id + lVar11));
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glAttachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x155);
      value = (char **)((long)&shader[0].source + lVar11);
      (**(code **)(lVar7 + 0x12b8))(*(undefined4 *)((long)&shader[0].id + lVar11),1,value,0);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glShaderSource call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x159);
      (**(code **)(lVar7 + 0x248))(*(undefined4 *)((long)&shader[0].id + lVar11));
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glCompileShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x15d);
      status_1 = 0;
      (**(code **)(lVar7 + 0xa70))(*(undefined4 *)((long)&shader[0].id + lVar11),0x8b81,&status_1);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x162);
      if (status_1 == 0) {
        log_size = 0;
        (**(code **)(lVar7 + 0xa70))(*(undefined4 *)((long)&shader[0].id + lVar11),0x8b84);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glGetShaderiv call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                        ,0x168);
        GVar2 = log_size;
        pcVar9 = (char *)operator_new__((long)log_size);
        (**(code **)(lVar7 + 0xa58))(*(undefined4 *)((long)&shader[0].id + lVar11),GVar2,0,pcVar9);
        attribute._M_dataplus._M_p = (pointer)((this->super_TestCase).m_context)->m_testCtx->m_log;
        psVar1 = &attribute._M_string_length;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
        std::operator<<((ostream *)psVar1,"Shader compilation has failed.\n");
        std::operator<<((ostream *)psVar1,"Shader type: ");
        local_1c8 = *(int *)((long)&shader[0].type + lVar11);
        _status = glu::getShaderTypeName;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&status,(ostream *)psVar1);
        std::operator<<((ostream *)psVar1,"\n");
        std::operator<<((ostream *)psVar1,"Shader compilation error log:\n");
        std::operator<<((ostream *)psVar1,pcVar9);
        std::operator<<((ostream *)psVar1,"\n");
        std::operator<<((ostream *)psVar1,"Shader source code:\n");
        this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)&attribute,value);
        std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n");
        tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
        operator_delete__(pcVar9);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glGetShaderInfoLog call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                        ,0x179);
        puVar10 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar10 = 0;
        __cxa_throw(puVar10,&int::typeinfo,0);
      }
    }
  }
  (**(code **)(lVar7 + 0x14c8))(GVar4,1,&BuildProgram::xfb_varying,0x8c8c);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x184);
  for (; (int)uVar12 < this->m_max_attributes; uVar12 = uVar12 + 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&status,"a_",(allocator<char> *)&log_size);
    Utilities::itoa_abi_cxx11_((string *)&status_1,(Utilities *)(ulong)uVar12,i);
    psVar8 = (string *)std::__cxx11::string::append((string *)&status);
    std::__cxx11::string::string((string *)&attribute,psVar8);
    std::__cxx11::string::~string((string *)&status_1);
    std::__cxx11::string::~string((string *)&status);
    (**(code **)(lVar7 + 0x38))(GVar4,uVar12,attribute._M_dataplus._M_p);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindAttribLocation call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x18b);
    std::__cxx11::string::~string((string *)&attribute);
  }
  (**(code **)(lVar7 + 0xce8))(GVar4);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x191);
  _status = (code *)((ulong)uStack_1cc << 0x20);
  (**(code **)(lVar7 + 0x9d8))(GVar4,0x8b82);
  if (status == 1) {
    for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 0x10) {
      if (*(int *)((long)&shader[0].id + lVar11) != 0) {
        (**(code **)(lVar7 + 0x4e0))(GVar4);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glDetachShader call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                        ,0x19f);
      }
    }
    for (lVar11 = 0xc; lVar11 != 0x2c; lVar11 = lVar11 + 0x10) {
      if (*(int *)((long)&shader[0].source + lVar11) != 0) {
        (**(code **)(lVar7 + 0x470))();
        *(undefined4 *)((long)&shader[0].source + lVar11) = 0;
      }
    }
    if (GVar4 != 0) {
      return GVar4;
    }
    puVar10 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar10 = 0;
    __cxa_throw(puVar10,&int::typeinfo,0);
  }
  status_1 = 0;
  (**(code **)(lVar7 + 0x9d8))(GVar4,0x8b84);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glGetProgramiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1a9);
  GVar2 = status_1;
  pcVar9 = (char *)operator_new__((long)status_1);
  (**(code **)(lVar7 + 0x988))(GVar4,GVar2,0,pcVar9);
  attribute._M_dataplus._M_p = (pointer)((this->super_TestCase).m_context)->m_testCtx->m_log;
  psVar1 = &attribute._M_string_length;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
  std::operator<<((ostream *)psVar1,"Program linkage has failed due to:\n");
  std::operator<<((ostream *)psVar1,pcVar9);
  std::operator<<((ostream *)psVar1,"\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&attribute,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
  operator_delete__(pcVar9);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glGetProgramInfoLog call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1b5);
  puVar10 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar10 = 0;
  __cxa_throw(puVar10,&int::typeinfo,0);
}

Assistant:

glw::GLuint EnableDisableAttributesTest::BuildProgram(const char* vertex_shader, const bool bind_even_or_odd)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* const source;
		glw::GLenum const		 type;
		glw::GLuint				 id;
	} shader[] = { { vertex_shader, GL_VERTEX_SHADER, 0 }, { s_fragment_shader, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	glw::GLuint po = 0;

	try
	{
		/* Create program. */
		po = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			if (DE_NULL != shader[i].source)
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(po, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, 1, &(shader[i].source), NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader compilation has failed.\n"
														<< "Shader type: " << glu::getShaderTypeStr(shader[i].type)
														<< "\n"
														<< "Shader compilation error log:\n"
														<< log_text << "\n"
														<< "Shader source code:\n"
														<< shader[i].source << "\n"
														<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Transform Feedback setup. */
		static const glw::GLchar* xfb_varying = "sum";

		gl.transformFeedbackVaryings(po, 1, &xfb_varying, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		for (glw::GLint i = (glw::GLint)(bind_even_or_odd); i < m_max_attributes; i += 2)
		{
			std::string attribute = std::string("a_").append(Utilities::itoa(i));

			gl.bindAttribLocation(po, i, attribute.c_str());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindAttribLocation call failed.");
		}

		/* Link. */
		gl.linkProgram(po);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(po, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(po, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(po, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(po, log_size, NULL, &log_text[0]);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Program linkage has failed due to:\n"
												<< log_text << "\n"
												<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (po)
		{
			gl.deleteProgram(po);

			po = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (0 == po)
	{
		throw 0;
	}

	return po;
}